

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1interval.cc
# Opt level: O0

double __thiscall S1Interval::GetComplementCenter(S1Interval *this)

{
  double dVar1;
  double dVar2;
  S1Interval *local_40;
  S1Interval local_28;
  S1Interval *local_18;
  S1Interval *this_local;
  
  local_18 = this;
  dVar1 = lo(this);
  dVar2 = hi(this);
  if ((dVar1 != dVar2) || (NAN(dVar1) || NAN(dVar2))) {
    local_28 = Complement(this);
    this_local = (S1Interval *)GetCenter(&local_28);
  }
  else {
    dVar1 = hi(this);
    if (0.0 < dVar1) {
      dVar1 = hi(this);
      local_40 = (S1Interval *)(dVar1 - 3.141592653589793);
    }
    else {
      dVar1 = hi(this);
      local_40 = (S1Interval *)(dVar1 + 3.141592653589793);
    }
    this_local = local_40;
  }
  return (double)this_local;
}

Assistant:

double S1Interval::GetComplementCenter() const {
  if (lo() != hi()) {
    return Complement().GetCenter();
  } else {  // Singleton.
    return (hi() <= 0) ? (hi() + M_PI) : (hi() - M_PI);
  }
}